

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O3

_Bool al_set_sample(ALLEGRO_SAMPLE_INSTANCE *spl,ALLEGRO_SAMPLE *data)

{
  ALLEGRO_MIXER *mixer;
  bool bVar1;
  undefined7 uVar2;
  ALLEGRO_AUDIO_DEPTH AVar3;
  ALLEGRO_CHANNEL_CONF AVar4;
  uint uVar5;
  int iVar6;
  _Bool _Var7;
  byte unaff_R13B;
  
  if ((spl->is_playing == true) && (_Var7 = al_set_sample_instance_playing(spl,false), !_Var7)) {
    return false;
  }
  mixer = (spl->parent).u.mixer;
  if (data == (ALLEGRO_SAMPLE *)0x0) {
    if (mixer != (ALLEGRO_MIXER *)0x0) {
      _al_kcm_detach_from_parent(spl);
    }
  }
  else {
    if (mixer == (ALLEGRO_MIXER *)0x0) {
      bVar1 = false;
    }
    else if ((((spl->spl_data).frequency == data->frequency) &&
             ((spl->spl_data).depth == data->depth)) &&
            ((spl->spl_data).chan_conf == data->chan_conf)) {
      bVar1 = false;
    }
    else {
      unaff_R13B = (spl->parent).is_voice;
      _al_kcm_detach_from_parent(spl);
      bVar1 = true;
    }
    AVar3 = data->depth;
    AVar4 = data->chan_conf;
    uVar5 = data->frequency;
    iVar6 = data->len;
    _Var7 = data->free_buf;
    uVar2 = *(undefined7 *)&data->field_0x19;
    (spl->spl_data).buffer = data->buffer;
    (spl->spl_data).free_buf = _Var7;
    *(undefined7 *)&(spl->spl_data).field_0x19 = uVar2;
    (spl->spl_data).dtor_item = data->dtor_item;
    (spl->spl_data).depth = AVar3;
    (spl->spl_data).chan_conf = AVar4;
    (spl->spl_data).frequency = uVar5;
    (spl->spl_data).len = iVar6;
    (spl->spl_data).free_buf = false;
    spl->pos = 0;
    spl->loop_start = 0;
    spl->loop_end = data->len;
    if (!bVar1) {
      return true;
    }
    if ((unaff_R13B & 1) == 0) {
      _Var7 = al_attach_sample_instance_to_mixer(spl,mixer);
    }
    else {
      _Var7 = al_attach_sample_instance_to_voice(spl,(ALLEGRO_VOICE *)mixer);
    }
    if (_Var7 != false) {
      return true;
    }
  }
  (spl->spl_data).buffer.f32 = (float *)0x0;
  return data == (ALLEGRO_SAMPLE *)0x0;
}

Assistant:

bool al_set_sample(ALLEGRO_SAMPLE_INSTANCE *spl, ALLEGRO_SAMPLE *data)
{
   sample_parent_t old_parent;
   bool need_reattach;

   ASSERT(spl);

   /* Stop the sample if it is playing. */
   if (spl->is_playing) {
      if (!al_set_sample_instance_playing(spl, false)) {
         /* Shouldn't happen. */
         ASSERT(false);
         return false;
      }
   }

   if (!data) {
      if (spl->parent.u.ptr) {
         _al_kcm_detach_from_parent(spl);
      }
      spl->spl_data.buffer.ptr = NULL;
      return true;
   }

   /* Have data. */

   need_reattach = false;
   if (spl->parent.u.ptr != NULL) {
      if (spl->spl_data.frequency != data->frequency ||
            spl->spl_data.depth != data->depth ||
            spl->spl_data.chan_conf != data->chan_conf) {
         old_parent = spl->parent;
         need_reattach = true;
         _al_kcm_detach_from_parent(spl);
      }
   }

   spl->spl_data = *data;
   spl->spl_data.free_buf = false;
   spl->pos = 0;
   spl->loop_start = 0;
   spl->loop_end = data->len;
   /* Should we reset the loop mode? */

   if (need_reattach) {
      if (old_parent.is_voice) {
         if (!al_attach_sample_instance_to_voice(spl, old_parent.u.voice)) {
            spl->spl_data.buffer.ptr = NULL;
            return false;
         }
      }
      else {
         if (!al_attach_sample_instance_to_mixer(spl, old_parent.u.mixer)) {
            spl->spl_data.buffer.ptr = NULL;
            return false;
         }
      }
   }

   return true;
}